

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

void sei_message_append(sei_t *sei,sei_message_t *msg)

{
  sei_message_t *msg_local;
  sei_t *sei_local;
  
  if (sei->head == (sei_message_t *)0x0) {
    sei->head = msg;
    sei->tail = msg;
  }
  else {
    sei->tail->next = msg;
    sei->tail = msg;
  }
  return;
}

Assistant:

void sei_message_append(sei_t* sei, sei_message_t* msg)
{
    if (0 == sei->head) {
        sei->head = msg;
        sei->tail = msg;
    } else {
        sei->tail->next = msg;
        sei->tail = msg;
    }
}